

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_e4955a::BacktraceData::Add
          (BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  cmListFileContext *value;
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var5;
  Value *pVVar6;
  mapped_type *pmVar7;
  string *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar8;
  cmListFileContext *top;
  ArrayIndex parent;
  ArrayIndex fileIndex;
  Value entry;
  cmListFileContext *local_168;
  Value *local_160;
  undefined1 local_158 [40];
  string local_130;
  ArrayIndex *local_110;
  _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_108;
  ArrayIndex local_fc;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  bVar1 = cmListFileBacktrace::Empty(bt);
  if (!bVar1) {
    local_168 = cmListFileBacktrace::Top(bt);
    iVar4 = std::
            _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->NodeMap)._M_h,&local_168);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_110 = index;
      local_108 = (_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->NodeMap;
      Json::Value::Value(&local_f8,objectValue);
      __k = &local_168->FilePath;
      _Var5._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->FileMap)._M_h,__k);
      if (_Var5._M_cur == (__node_type *)0x0) {
        local_160 = &this->Files;
        local_fc = Json::Value::size(local_160);
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->FileMap,__k);
        _Var5._M_cur = (__node_type *)
                       pVar8.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur;
        RelativeIfUnder(&local_130,&this->TopSource,__k);
        Json::Value::Value((Value *)local_158,&local_130);
        Json::Value::append(local_160,(Value *)local_158);
        Json::Value::~Value((Value *)local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_130._M_dataplus._M_p._4_4_,(ArrayIndex)local_130._M_dataplus._M_p) !=
            &local_130.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_130._M_dataplus._M_p._4_4_,
                                   (ArrayIndex)local_130._M_dataplus._M_p),
                          local_130.field_2._M_allocated_capacity + 1);
        }
      }
      Json::Value::Value(&local_58,
                         *(UInt *)((long)&((_Var5._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                          ._M_storage._M_storage + 0x20));
      pVVar6 = Json::Value::operator[](&local_f8,"file");
      Json::Value::operator=(pVVar6,&local_58);
      Json::Value::~Value(&local_58);
      if (local_168->Line != 0) {
        Json::Value::Value(&local_80,(Int)local_168->Line);
        pVVar6 = Json::Value::operator[](&local_f8,"line");
        Json::Value::operator=(pVVar6,&local_80);
        Json::Value::~Value(&local_80);
      }
      value = local_168;
      if ((local_168->Name)._M_string_length != 0) {
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->CommandMap)._M_h,&local_168->Name);
        if (_Var5._M_cur == (__node_type *)0x0) {
          local_160 = &this->Commands;
          local_130._M_dataplus._M_p._0_4_ = Json::Value::size(local_160);
          pVar8 = std::
                  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              *)&this->CommandMap,value);
          _Var5._M_cur = (__node_type *)
                         pVar8.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                         ._M_cur;
          Json::Value::Value((Value *)local_158,&value->Name);
          Json::Value::append(local_160,(Value *)local_158);
          Json::Value::~Value((Value *)local_158);
        }
        Json::Value::Value(&local_a8,
                           *(UInt *)((long)&((_Var5._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                            ._M_storage._M_storage + 0x20));
        pVVar6 = Json::Value::operator[](&local_f8,"command");
        Json::Value::operator=(pVVar6,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      cmListFileBacktrace::Pop((cmListFileBacktrace *)local_158);
      bVar2 = Add(this,(cmListFileBacktrace *)local_158,(ArrayIndex *)&local_130);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
      }
      if (bVar2) {
        Json::Value::Value(&local_d0,(ArrayIndex)local_130._M_dataplus._M_p);
        pVVar6 = Json::Value::operator[](&local_f8,"parent");
        Json::Value::operator=(pVVar6,&local_d0);
        Json::Value::~Value(&local_d0);
      }
      AVar3 = Json::Value::size(&this->Nodes);
      pmVar7 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_108,&local_168);
      *pmVar7 = AVar3;
      *local_110 = AVar3;
      Json::Value::append(&this->Nodes,&local_f8);
      Json::Value::~Value(&local_f8);
    }
    else {
      *index = *(ArrayIndex *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                       ._M_cur + 0x10);
    }
  }
  return !bVar1;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}